

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O2

void __thiscall helics::TranslatorFederate::~TranslatorFederate(TranslatorFederate *this)

{
  this->mHandles = (HandleManager *)0x0;
  this->current_state = CREATED;
  std::function<void_(const_helics::ActionMessage_&)>::operator=
            (&this->mQueueMessage,(nullptr_t)0x0);
  std::function<void_(helics::ActionMessage_&&)>::operator=(&this->mQueueMessageMove,(nullptr_t)0x0)
  ;
  std::function<void_(const_helics::ActionMessage_&)>::operator=(&this->mSendMessage,(nullptr_t)0x0)
  ;
  std::function<void_(helics::ActionMessage_&&)>::operator=(&this->mSendMessageMove,(nullptr_t)0x0);
  std::function<void_(helics::ActionMessage_&)>::operator=(&this->mDeliverMessage,(nullptr_t)0x0);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator=(&this->mLogger,(nullptr_t)0x0);
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  operator=(&this->mGetAirLock,(nullptr_t)0x0);
  gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::clear
            (&this->translators);
  gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::
  ~MappedPointerVector(&this->translators);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->mGetAirLock);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->mLogger);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->mDeliverMessage);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->mSendMessageMove);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->mSendMessage);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->mQueueMessageMove);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->mQueueMessage);
  TimeCoordinator::~TimeCoordinator(&this->mCoord);
  std::__cxx11::string::~string((string *)&this->mName);
  return;
}

Assistant:

TranslatorFederate::~TranslatorFederate()
{
    mHandles = nullptr;
    current_state = FederateStates::CREATED;

    mQueueMessage = nullptr;
    mQueueMessageMove = nullptr;
    mSendMessage = nullptr;
    mSendMessageMove = nullptr;
    mDeliverMessage = nullptr;

    mLogger = nullptr;
    mGetAirLock = nullptr;

    translators.clear();
}